

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall
phosg::Image::draw_text_v
          (Image *this,ssize_t x,ssize_t y,ssize_t *width,ssize_t *height,uint64_t r,uint64_t g,
          uint64_t b,uint64_t a,uint64_t br,uint64_t bg,uint64_t bb,uint64_t ba,char *fmt,
          __va_list_tag *va)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  ssize_t xx;
  long lVar5;
  undefined1 *puVar6;
  ulong uVar7;
  long local_90;
  long local_88;
  string buffer;
  
  string_vprintf_abi_cxx11_(&buffer,(phosg *)fmt,(char *)va,(__va_list_tag *)width);
  lVar4 = x;
  local_90 = y;
  if (buffer._M_string_length == 0) {
    local_88 = 0;
  }
  else {
    local_88 = 0;
    uVar7 = 0;
    do {
      bVar1 = buffer._M_dataplus._M_p[uVar7];
      if (bVar1 == 10) {
        if (ba != 0) {
          fill_rect(this,lVar4 + -1,local_90 + -1,1,9,br,bg,bb,ba);
        }
        local_90 = local_90 + 8;
        lVar4 = x;
        if (local_88 <= x) {
          local_88 = x;
        }
      }
      else if (bVar1 != 0xd) {
        uVar2 = bVar1 - 0x20 & 0xff;
        if ((char)bVar1 < ' ') {
          uVar2 = 0x5f;
        }
        if (ba != 0) {
          fill_rect(this,lVar4 + -1,local_90 + -1,6,9,br,bg,bb,ba);
        }
        puVar6 = font + (ulong)uVar2 * 0x23;
        lVar3 = 0;
        do {
          lVar5 = 0;
          do {
            if (puVar6[lVar5] != '\0') {
              write_pixel(this,lVar4 + lVar5,local_90 + lVar3,r,g,b,a);
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 != 5);
          lVar3 = lVar3 + 1;
          puVar6 = puVar6 + 5;
        } while (lVar3 != 7);
        lVar4 = lVar4 + 6;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < buffer._M_string_length);
  }
  fill_rect(this,lVar4 + -1,local_90 + -1,1,9,br,bg,bb,ba);
  if (width != (ssize_t *)0x0) {
    if (local_88 < lVar4) {
      local_88 = lVar4;
    }
    *width = local_88 - x;
  }
  if (height != (ssize_t *)0x0) {
    *height = (local_90 - y) + 7;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)buffer._M_dataplus._M_p != &buffer.field_2) {
    operator_delete(buffer._M_dataplus._M_p,buffer.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Image::draw_text_v(ssize_t x, ssize_t y, ssize_t* width, ssize_t* height,
    uint64_t r, uint64_t g, uint64_t b, uint64_t a, uint64_t br, uint64_t bg,
    uint64_t bb, uint64_t ba, const char* fmt, va_list va) {

  string buffer = string_vprintf(fmt, va);

  ssize_t max_x_pos = 0;
  ssize_t x_pos = x, y_pos = y;
  for (size_t z = 0; z < buffer.size(); z++) {
    uint8_t ch = buffer[z];
    if (ch == '\r') {
      continue;
    }
    if (ch == '\n') {
      if (ba) {
        this->fill_rect(x_pos - 1, y_pos - 1, 1, 9, br, bg, bb, ba);
      }
      y_pos += 8;
      x_pos = x;
      if (x_pos > max_x_pos) {
        max_x_pos = x_pos;
      }
      continue;
    }

    if (ch < 0x20 || ch > 0x7F) {
      ch = 0x7F;
    }
    ch -= 0x20;

    if (ba) {
      this->fill_rect(x_pos - 1, y_pos - 1, 6, 9, br, bg, bb, ba);
    }
    for (ssize_t yy = 0; yy < 7; yy++) {
      for (ssize_t xx = 0; xx < 5; xx++) {
        if (!font[ch][yy * 5 + xx]) {
          continue;
        }
        try {
          this->write_pixel(x_pos + xx, y_pos + yy, r, g, b, a);
        } catch (const out_of_range& e) {
        }
      }
    }

    x_pos += 6;
  }

  this->fill_rect(x_pos - 1, y_pos - 1, 1, 9, br, bg, bb, ba);

  if (width) {
    *width = (x_pos > max_x_pos ? x_pos : max_x_pos) - x;
  }
  if (height) {
    *height = y_pos + 7 - y;
  }
}